

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Option::_validate(string *__return_storage_ptr__,Option *this,string *result,int index)

{
  pointer pVVar1;
  pointer this_00;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((result->_M_string_length != 0) || (this->expected_min_ != 0)) {
    this_00 = (this->validators_).
              super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar1 = (this->validators_).super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != pVVar1) {
      do {
        if (this_00->application_index_ == -1 || this_00->application_index_ == index) {
          Validator::operator()(&local_50,this_00,result);
          ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if (__return_storage_ptr__->_M_string_length != 0) {
            return __return_storage_ptr__;
          }
        }
        this_00 = this_00 + 1;
      } while (this_00 != pVVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string _validate(std::string &result, int index) const {
        std::string err_msg;
        if(result.empty() && expected_min_ == 0) {
            // an empty with nothing expected is allowed
            return err_msg;
        }
        for(const auto &vali : validators_) {
            auto v = vali.get_application_index();
            if(v == -1 || v == index) {
                try {
                    err_msg = vali(result);
                } catch(const ValidationError &err) {
                    err_msg = err.what();
                }
                if(!err_msg.empty())
                    break;
            }
        }

        return err_msg;
    }